

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Nullability __thiscall
wasm::TranslateToFuzzReader::getSubType(TranslateToFuzzReader *this,Nullability nullability)

{
  Nullability nullability_local;
  TranslateToFuzzReader *this_local;
  
  if (nullability == NonNullable) {
    this_local._4_4_ = NonNullable;
  }
  else {
    this_local._4_4_ = getNullability(this);
  }
  return this_local._4_4_;
}

Assistant:

Nullability TranslateToFuzzReader::getSubType(Nullability nullability) {
  if (nullability == NonNullable) {
    return NonNullable;
  }
  return getNullability();
}